

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O1

uint32_t __thiscall ram::MinimizerEngine::Index::Find(Index *this,uint64_t key,uint64_t **dst)

{
  __node_base_ptr p_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  key_type local_20;
  
  local_20 = key * 2;
  p_Var3 = (_Hash_node_base *)0x0;
  p_Var1 = std::
           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_ram::MinimizerEngine::Index::KeyEqual,_ram::MinimizerEngine::Index::Hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->locator)._M_h,
                      (key & 0x7fffffffffffffff) % (this->locator)._M_h._M_bucket_count,&local_20,
                      key & 0x7fffffffffffffff);
  p_Var2 = (_Hash_node_base *)0x0;
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var2 = p_Var1->_M_nxt;
  }
  if (p_Var2 != (_Hash_node_base *)0x0) {
    if (((ulong)p_Var2[1]._M_nxt & 1) == 0) {
      p_Var3 = p_Var2[2]._M_nxt;
      *dst = (uint64_t *)
             (((ulong)p_Var3 >> 0x1d & 0xfffffffffffffff8) +
             (long)(this->origins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    }
    else {
      *dst = (uint64_t *)(p_Var2 + 2);
      p_Var3 = (_Hash_node_base *)0x1;
    }
  }
  return (uint32_t)p_Var3;
}

Assistant:

std::uint32_t MinimizerEngine::Index::Find(
    std::uint64_t key,
    const std::uint64_t** dst) const {
  auto it = locator.find(key << 1);
  if (it == locator.end()) {
    return 0;
  }
  if (it->first & 1) {
    *dst = &(it->second);
    return 1;
  }
  *dst = &(origins[it->second >> 32]);
  return static_cast<std::uint32_t>(it->second);
}